

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateGradient
          (CostAttributes *this,double time,VectorDynSize *values,VectorDynSize *partialDerivative,
          string *label)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  element_type *peVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  char *pcVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *this_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *pMVar11;
  string *in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  CostAttributes *in_RDI;
  double in_XMM0_Qa;
  ostringstream errorTag_2;
  ostringstream errorMsg_2;
  ostringstream errorTag_1;
  ostringstream errorMsg_1;
  VectorDynSize *desired;
  bool isValid;
  ostringstream errorTag;
  ostringstream errorMsg;
  DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffff478;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff480;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff490;
  VectorDynSize *in_stack_fffffffffffff498;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff4a0;
  string local_9e0 [32];
  string local_9c0 [32];
  ostringstream local_9a0 [376];
  ostringstream local_828 [376];
  string local_6b0 [32];
  string local_690 [32];
  ostringstream local_670 [376];
  ostringstream local_4f8 [376];
  undefined8 local_380;
  byte local_371;
  string local_370 [32];
  string local_350 [48];
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  string *local_30;
  undefined8 local_20;
  double local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize(in_RDX);
  bVar1 = CostAttributes::isValid(in_RDI);
  if (bVar1) {
    lVar4 = iDynTree::VectorDynSize::size();
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x34de01);
    (*peVar5->_vptr_Selector[3])();
    lVar6 = iDynTree::MatrixDynSize::cols();
    if (lVar4 == lVar6) {
      peVar10 = std::
                __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x34e002);
      iVar2 = (*peVar10->_vptr_TimeVaryingObject[2])(local_18,peVar10,&local_371);
      local_380 = CONCAT44(extraout_var,iVar2);
      if ((local_371 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_4f8);
        std::__cxx11::ostringstream::ostringstream(local_670);
        poVar7 = std::operator<<((ostream *)local_670,"costFirstPartialDerivativeWRT");
        std::operator<<(poVar7,local_30);
        poVar7 = std::operator<<((ostream *)local_4f8,"Unable to retrieve a valid desired ");
        poVar7 = std::operator<<(poVar7,local_30);
        poVar7 = std::operator<<(poVar7," at time: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
        std::operator<<(poVar7,".");
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("L2NormCost",pcVar8,pcVar9);
        std::__cxx11::string::~string(local_6b0);
        std::__cxx11::string::~string(local_690);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_670);
        std::__cxx11::ostringstream::~ostringstream(local_4f8);
      }
      else {
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x34e23d);
        uVar3 = Selector::size((Selector *)0x34e245);
        this_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)(ulong)uVar3;
        pMVar11 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::VectorDynSize::size();
        if (this_00 == pMVar11) {
          peVar5 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x34e473);
          (*peVar5->_vptr_Selector[2])(peVar5,local_20);
          toEigen(in_stack_fffffffffffff498);
          toEigen(in_stack_fffffffffffff498);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>
          ::operator-(this_00,in_stack_fffffffffffff4a0);
          toEigen(in_stack_fffffffffffff498);
          Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                    (in_stack_fffffffffffff480,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)in_stack_fffffffffffff478);
          toEigen((MatrixDynSize *)this_00);
          toEigen(in_stack_fffffffffffff498);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
          operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff498,in_stack_fffffffffffff490);
          toEigen(in_stack_fffffffffffff498);
          Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                    (in_stack_fffffffffffff480,in_stack_fffffffffffff478);
          local_1 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_828);
          std::__cxx11::ostringstream::ostringstream(local_9a0);
          poVar7 = std::operator<<((ostream *)local_9a0,"costFirstPartialDerivativeWRT");
          std::operator<<(poVar7,local_30);
          poVar7 = std::operator<<((ostream *)local_828,"The desired ");
          poVar7 = std::operator<<(poVar7,local_30);
          poVar7 = std::operator<<(poVar7,
                                   " dimension does not match the size of the selector at time: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
          std::operator<<(poVar7,".");
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::ostringstream::str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("L2NormCost",pcVar8,pcVar9);
          std::__cxx11::string::~string(local_9e0);
          std::__cxx11::string::~string(local_9c0);
          local_1 = 0;
          std::__cxx11::ostringstream::~ostringstream(local_9a0);
          std::__cxx11::ostringstream::~ostringstream(local_828);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__cxx11::ostringstream::ostringstream(local_320);
      poVar7 = std::operator<<((ostream *)local_320,"costFirstPartialDerivativeWRT");
      std::operator<<(poVar7,local_30);
      poVar7 = std::operator<<((ostream *)local_1a8,"The ");
      poVar7 = std::operator<<(poVar7,local_30);
      std::operator<<(poVar7," dimension is not the one expected from the specified selector.");
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("L2NormCost",pcVar8,pcVar9);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_350);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  else {
    iDynTree::VectorDynSize::zero();
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool evaluateGradient(double time, const VectorDynSize& values, VectorDynSize& partialDerivative, const std::string &label) {
                partialDerivative.resize(values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costFirstPartialDerivativeWRT" << label;;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);
                iDynTree::toEigen(partialDerivative) = iDynTree::toEigen(gradientSubMatrix) * iDynTree::toEigen(buffer);

                return true;
            }